

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O0

void libtorrent::add_files
               (file_storage *fs,string *file,
               function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *p,create_flags_t flags)

{
  undefined4 in_register_0000000c;
  char *pcVar1;
  string_view f;
  string local_a8;
  undefined1 local_78 [16];
  string local_68;
  string local_48;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *local_28;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *p_local;
  string *file_local;
  file_storage *fs_local;
  create_flags_t flags_local;
  
  pcVar1 = (char *)CONCAT44(in_register_0000000c,flags.m_val);
  local_28 = p;
  p_local = (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)file;
  file_local = (string *)fs;
  fs_local._4_4_ = flags.m_val;
  local_78 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)file);
  f._M_len = local_78._8_8_;
  f._M_str = pcVar1;
  complete_abi_cxx11_(&local_68,local_78._0_8_,f);
  parent_path(&local_48,&local_68);
  filename(&local_a8,(string *)p_local);
  anon_unknown_40::add_files_impl(fs,&local_48,&local_a8,p,fs_local._4_4_);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void add_files(file_storage& fs, std::string const& file
		, std::function<bool(std::string)> p, create_flags_t const flags)
	{
		add_files_impl(fs, parent_path(complete(file)), filename(file), p, flags);
	}